

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

Arena * __thiscall
google::protobuf::FileDescriptorProto::GetArenaNoVirtual(FileDescriptorProto *this)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  Container *pCVar1;
  long in_RDI;
  Arena *local_18;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RDI + 8);
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    pCVar1 = internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             ::
             PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                       (this_00);
    local_18 = pCVar1->arena;
  }
  else {
    local_18 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::PtrValue<google::protobuf::Arena>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  return local_18;
}

Assistant:

inline void* MaybeArenaPtr() const {
    return _internal_metadata_.raw_arena_ptr();
  }